

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O1

uint aom_highbd_10_mse16x16_c(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,uint32_t *sse)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int j;
  long lVar6;
  int iVar7;
  
  lVar3 = (long)ref * 2;
  lVar4 = (long)src * 2;
  iVar5 = 0;
  lVar2 = 0;
  do {
    lVar6 = 0;
    do {
      iVar7 = (uint)*(ushort *)(lVar4 + lVar6 * 2) - (uint)*(ushort *)(lVar3 + lVar6 * 2);
      lVar2 = lVar2 + (ulong)(uint)(iVar7 * iVar7);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x10);
    iVar5 = iVar5 + 1;
    lVar3 = lVar3 + (long)ref_stride * 2;
    lVar4 = lVar4 + (long)src_stride * 2;
  } while (iVar5 != 0x10);
  uVar1 = (uint)(lVar2 + 8U >> 4);
  *sse = uVar1;
  return uVar1;
}

Assistant:

static void highbd_variance64(const uint8_t *a8, int a_stride,
                              const uint8_t *b8, int b_stride, int w, int h,
                              uint64_t *sse, int64_t *sum) {
  const uint16_t *a = CONVERT_TO_SHORTPTR(a8);
  const uint16_t *b = CONVERT_TO_SHORTPTR(b8);
  int64_t tsum = 0;
  uint64_t tsse = 0;
  for (int i = 0; i < h; ++i) {
    int32_t lsum = 0;
    for (int j = 0; j < w; ++j) {
      const int diff = a[j] - b[j];
      lsum += diff;
      tsse += (uint32_t)(diff * diff);
    }
    tsum += lsum;
    a += a_stride;
    b += b_stride;
  }
  *sum = tsum;
  *sse = tsse;
}